

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

void tinyobj::SplitString
               (string *s,char delim,char escape,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *elems)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  char *pcVar5;
  char in_DL;
  char in_SIL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char ch;
  int i;
  bool escaping;
  string token;
  value_type *in_stack_ffffffffffffffa8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb0;
  int local_40;
  string local_38 [46];
  char local_a;
  char local_9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8;
  
  local_a = in_DL;
  local_9 = in_SIL;
  local_8 = in_RDI;
  std::__cxx11::string::string(local_38);
  bVar2 = false;
  local_40 = 0;
  do {
    sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (local_8);
    if (sVar4 <= (ulong)(long)local_40) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      std::__cxx11::string::~string(local_38);
      return;
    }
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_8);
    cVar1 = *pcVar5;
    if (bVar2) {
      bVar2 = false;
LAB_001af598:
      std::__cxx11::string::operator+=(local_38,cVar1);
    }
    else if (cVar1 == local_a) {
      bVar2 = true;
    }
    else {
      if (cVar1 != local_9) goto LAB_001af598;
      bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x1af557);
      if (!bVar3) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1af592);
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

static void SplitString(const std::string &s, char delim, char escape,
                        std::vector<std::string> &elems) {
  std::string token;

  bool escaping = false;
  for (int i = 0; i < s.size(); ++i) {
    char ch = s[i];
    if (escaping) {
      escaping = false;
    } else if (ch == escape) {
      escaping = true;
      continue;
    } else if (ch == delim) {
      if (!token.empty()) {
        elems.push_back(token);
      }
      token.clear();
      continue;
    }
    token += ch;
  }

  elems.push_back(token);
}